

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint uVar5;
  void *pvVar6;
  undefined8 *puVar7;
  TValue *pTVar8;
  uint64_t *puVar9;
  Node *n_1;
  uint32_t i_3;
  global_State *g_1;
  uint32_t i_2;
  TValue *array_1;
  global_State *g;
  TValue *oarray;
  void *pvStack_120;
  uint32_t i;
  TValue *array;
  uint32_t oldhmask;
  uint32_t oldasize;
  Node *oldnode;
  uint32_t hbits_local;
  uint32_t asize_local;
  GCtab *t_local;
  lua_State *L_local;
  Node *n;
  Node *node_1;
  uint32_t hmask;
  uint32_t i_1;
  Node *node;
  uint32_t hsize;
  
  uVar3 = (t->node).ptr64;
  uVar1 = t->asize;
  uVar2 = t->hmask;
  if (uVar1 < asize) {
    if (0x8000001 < asize) {
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    if (t->colo < '\x01') {
      pvStack_120 = lj_mem_realloc(L,(void *)(t->array).ptr64,(ulong)uVar1 << 3,(ulong)asize << 3);
    }
    else {
      uVar4 = (t->array).ptr64;
      pvStack_120 = lj_mem_realloc(L,(void *)0x0,0,(ulong)asize << 3);
      t->colo = t->colo | 0x80;
      for (oarray._4_4_ = 0; oarray._4_4_ < uVar1; oarray._4_4_ = oarray._4_4_ + 1) {
        *(undefined8 *)((long)pvStack_120 + (ulong)oarray._4_4_ * 8) =
             *(undefined8 *)(uVar4 + (ulong)oarray._4_4_ * 8);
      }
    }
    (t->array).ptr64 = (uint64_t)pvStack_120;
    t->asize = asize;
    for (oarray._4_4_ = uVar1; oarray._4_4_ < asize; oarray._4_4_ = oarray._4_4_ + 1) {
      *(undefined8 *)((long)pvStack_120 + (ulong)oarray._4_4_ * 8) = 0xffffffffffffffff;
    }
  }
  if (hbits == 0) {
    uVar4 = (L->glref).ptr64;
    (t->node).ptr64 = uVar4 + 0xf8;
    (t->freetop).ptr64 = uVar4 + 0xf8;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar5 = 1 << ((byte)hbits & 0x1f);
    pvVar6 = lj_mem_realloc(L,(void *)0x0,0,(ulong)uVar5 * 0x18);
    (t->node).ptr64 = (uint64_t)pvVar6;
    (t->freetop).ptr64 = (uint64_t)((long)pvVar6 + (ulong)uVar5 * 0x18);
    t->hmask = uVar5 - 1;
    uVar5 = t->hmask;
    uVar4 = (t->node).ptr64;
    for (node_1._4_4_ = 0; node_1._4_4_ <= uVar5; node_1._4_4_ = node_1._4_4_ + 1) {
      puVar7 = (undefined8 *)(uVar4 + (ulong)node_1._4_4_ * 0x18);
      puVar7[2] = 0;
      puVar7[1] = 0xffffffffffffffff;
      *puVar7 = 0xffffffffffffffff;
    }
  }
  if (asize < uVar1) {
    pvVar6 = (void *)(t->array).ptr64;
    t->asize = asize;
    for (g_1._4_4_ = asize; g_1._4_4_ < uVar1; g_1._4_4_ = g_1._4_4_ + 1) {
      if (*(long *)((long)pvVar6 + (ulong)g_1._4_4_ * 8) != -1) {
        pTVar8 = lj_tab_setinth(L,t,g_1._4_4_);
        *pTVar8 = *(TValue *)((long)pvVar6 + (ulong)g_1._4_4_ * 8);
      }
    }
    if (t->colo < '\x01') {
      pvVar6 = lj_mem_realloc(L,pvVar6,(ulong)uVar1 << 3,(ulong)asize << 3);
      (t->array).ptr64 = (uint64_t)pvVar6;
    }
  }
  if (uVar2 != 0) {
    for (n_1._4_4_ = 0; n_1._4_4_ <= uVar2; n_1._4_4_ = n_1._4_4_ + 1) {
      puVar9 = (uint64_t *)(uVar3 + (ulong)n_1._4_4_ * 0x18);
      if (*puVar9 != 0xffffffffffffffff) {
        pTVar8 = lj_tab_set(L,t,(cTValue *)(puVar9 + 1));
        pTVar8->u64 = *puVar9;
      }
    }
    puVar7 = (undefined8 *)(L->glref).ptr64;
    puVar7[2] = puVar7[2] + (ulong)(uVar2 + 1) * -0x18;
    (*(code *)*puVar7)(puVar7[1],uVar3,(ulong)(uVar2 + 1) * 0x18,0);
  }
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}